

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

nanoseconds __thiscall anon_unknown.dwarf_e668::MovieState::getMasterClock(MovieState *this)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  nanoseconds nVar2;
  
  if (this->mAVSyncType == Audio) {
    __mutex = (pthread_mutex_t *)&(this->mAudio).mSrcMutex;
    std::mutex::lock((mutex *)&__mutex->__data);
    nVar2 = AudioState::getClockNoLock(&this->mAudio);
  }
  else {
    if (this->mAVSyncType != Video) {
      lVar1 = av_gettime();
      return (nanoseconds)((lVar1 - (this->mClockBase).__r) * 1000);
    }
    __mutex = (pthread_mutex_t *)&(this->mVideo).mDispPtsMutex;
    std::mutex::lock((mutex *)&__mutex->__data);
    lVar1 = av_gettime();
    nVar2.__r = (lVar1 - (this->mVideo).mDisplayPtsTime.__r) * 1000 + (this->mVideo).mDisplayPts.__r
    ;
  }
  pthread_mutex_unlock(__mutex);
  return (nanoseconds)nVar2.__r;
}

Assistant:

nanoseconds MovieState::getMasterClock()
{
    if(mAVSyncType == SyncMaster::Video)
        return mVideo.getClock();
    if(mAVSyncType == SyncMaster::Audio)
        return mAudio.getClock();
    return getClock();
}